

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdeclnode.cpp
# Opt level: O0

void __thiscall FuncDeclNode::print(FuncDeclNode *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference this_00;
  pointer pAVar4;
  pointer pTVar5;
  pointer pSVar6;
  unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *a;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
  *__range2;
  FuncDeclNode *this_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  poVar2 = std::operator<<(poVar2,";");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  poVar2 = std::operator<<(poVar2,"[label=\"FuncDecl\\nname=");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  poVar2 = std::operator<<(poVar2,"\"];");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::
          vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
          ::size(&this->args);
  if (sVar3 != 0) {
    __end2 = std::
             vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
             ::begin(&this->args);
    a = (unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *)
        std::
        vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
        ::end(&this->args);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                                       *)&a), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                ::operator*(&__end2);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
      std::operator<<(poVar2,"--");
      pAVar4 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(this_00);
      (*(pAVar4->super_VarNode).super_ASTNode._vptr_ASTNode[4])();
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  std::operator<<(poVar2,"--");
  pTVar5 = std::unique_ptr<TypeNode,_std::default_delete<TypeNode>_>::operator->(&this->returnType);
  (*(pTVar5->super_ASTNode)._vptr_ASTNode[4])();
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(this->super_ASTNode).currentNode);
  std::operator<<(poVar2,"--");
  pSVar6 = std::unique_ptr<SequenceNode,_std::default_delete<SequenceNode>_>::operator->
                     (&this->body);
  (*(pSVar6->super_ASTNode)._vptr_ASTNode[4])();
  return;
}

Assistant:

void FuncDeclNode::print() {
    std::cout << currentNode << ";" << std::endl;
    std::cout << currentNode << "[label=\"FuncDecl\\nname=" << name << "\"];" << std::endl;


    if (args.size() > 0) {
        for (const auto& a : args) {
            std::cout << currentNode << "--"; a->print();
        }
    }

    std::cout << currentNode << "--"; returnType->print();
    std::cout << currentNode << "--"; body->print();
}